

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_runtime.h
# Opt level: O2

void __thiscall
tvm::runtime::GraphRuntime::Node::LoadAttrs(Node *this,JSONReader *reader,TVMOpParam *param)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  int in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdec;
  LogCheckError _check_err;
  string value;
  string key;
  LogMessageFatal local_1b8;
  
  key._M_dataplus._M_p = (pointer)&key.field_2;
  key._M_string_length = 0;
  key.field_2._M_local_buf[0] = '\0';
  value._M_dataplus._M_p = (pointer)&value.field_2;
  value._M_string_length = 0;
  value.field_2._M_local_buf[0] = '\0';
  dmlc::JSONReader::BeginObject(reader);
  while( true ) {
    bVar1 = dmlc::JSONReader::NextObjectItem(reader,&key);
    if (!bVar1) break;
    dmlc::JSONReader::ReadString(reader,&value);
    bVar1 = std::operator==(&key,"func_name");
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)param);
    }
    else {
      bVar1 = std::operator==(&key,"num_inputs");
      if (bVar1) {
        uVar2 = strtoul(value._M_dataplus._M_p,(char **)0x0,10);
        param->num_inputs = (uint32_t)uVar2;
      }
      else {
        bVar1 = std::operator==(&key,"num_outputs");
        if (bVar1) {
          uVar2 = strtoul(value._M_dataplus._M_p,(char **)0x0,10);
          param->num_outputs = (uint32_t)uVar2;
        }
        else {
          bVar1 = std::operator==(&key,"flatten_data");
          if (bVar1) {
            uVar2 = strtoul(value._M_dataplus._M_p,(char **)0x0,10);
            param->flatten_data = (uint32_t)uVar2;
          }
        }
      }
    }
  }
  dmlc::LogCheck_EQ(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8);
  if (_check_err.str != (string *)0x0) {
    dmlc::LogMessageFatal::LogMessageFatal
              (&local_1b8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/liueo[P]TVM-deploy/./tvm/src/runtime/graph/graph_runtime.h"
               ,0xf4);
    poVar3 = std::operator<<((ostream *)&local_1b8,"Check failed: ");
    poVar3 = std::operator<<(poVar3,"bitmask == 1|2|4|8");
    poVar3 = std::operator<<(poVar3,(string *)_check_err.str);
    poVar3 = std::operator<<(poVar3,": ");
    std::operator<<(poVar3,"invalid format");
    dmlc::LogMessageFatal::~LogMessageFatal(&local_1b8);
  }
  dmlc::LogCheckError::~LogCheckError(&_check_err);
  std::__cxx11::string::~string((string *)&value);
  std::__cxx11::string::~string((string *)&key);
  return;
}

Assistant:

void LoadAttrs(dmlc::JSONReader *reader, TVMOpParam* param) {
      int bitmask = 0;
      std::string key, value;
      reader->BeginObject();
      while (reader->NextObjectItem(&key)) {
        reader->Read(&value);
        if (key == "func_name") {
          param->func_name = value;
          bitmask |= 1;
        } else if (key == "num_inputs") {
          param->num_inputs = strtoul(value.c_str(), nullptr, 10);
          bitmask |= 2;
        } else if (key == "num_outputs") {
          param->num_outputs = strtoul(value.c_str(), nullptr, 10);
          bitmask |= 4;
        } else if (key == "flatten_data") {
          param->flatten_data = strtoul(value.c_str(), nullptr, 10);
          bitmask |= 8;
        }
      }
      CHECK_EQ(bitmask, 1|2|4|8) << "invalid format";
    }